

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

void __thiscall xray_re::xr_object::load_object(xr_object *this,xr_reader *r)

{
  uint *puVar1;
  uint32_t *puVar2;
  pointer ppxVar3;
  f_r_new<xray_re::xr_surface> read;
  f_r_new<xray_re::xr_bone> read_00;
  f_r_new<xray_re::xr_bone> read_01;
  f_r_new<xray_re::xr_skl_motion> read_02;
  f_r_new<xray_re::xr_partition> read_03;
  f_r_new<xray_re::xr_surface> read_04;
  uint __line;
  size_t sVar4;
  char *__assertion;
  pointer ppxVar5;
  undefined1 auStack_38 [14];
  uint16_t version;
  xr_reader *s;
  
  sVar4 = xr_reader::r_chunk<unsigned_short>(r,0x900,&version);
  if (sVar4 == 0) {
    __assertion = "0";
    __line = 0x7c;
  }
  else {
    if (version == 0x10) {
      sVar4 = xr_reader::r_chunk<unsigned_int>(r,0x903,&this->m_flags);
      if (sVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                      ,0x80,"virtual void xray_re::xr_object::load_object(xr_reader &)");
      }
      sVar4 = xr_reader::find_chunk(r,0x912);
      if (sVar4 != 0) {
        xr_reader::r_sz(r,&this->m_userdata);
      }
      sVar4 = xr_reader::find_chunk(r,0x925);
      if (sVar4 != 0) {
        xr_reader::r_sz(r,&this->m_lod_ref);
      }
      sVar4 = xr_reader::find_chunk(r,0x907);
      if ((sVar4 == 0) && (sVar4 = xr_reader::find_chunk(r,0x906), sVar4 == 0)) {
        sVar4 = xr_reader::find_chunk(r,0x905);
        if (sVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                        ,0x9d,"virtual void xray_re::xr_object::load_object(xr_reader &)");
        }
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        read_04._14_2_ = version;
        read_04._0_14_ = auStack_38;
        xr_reader::
        r_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_reader::f_r_new<xray_re::xr_surface>>
                  (r,(ulong)*puVar1,&this->m_surfaces,read_04);
        sVar4 = xr_reader::find_chunk(r,0x918);
        if (sVar4 != 0) {
          ppxVar3 = (this->m_surfaces).
                    super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppxVar5 = (this->m_surfaces).
                         super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppxVar5 != ppxVar3;
              ppxVar5 = ppxVar5 + 1) {
            xr_reader::skip_sz(r);
            std::__cxx11::string::assign((char *)&(*ppxVar5)->m_cshader);
          }
        }
      }
      else {
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        read._14_2_ = version;
        read._0_14_ = auStack_38;
        xr_reader::
        r_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_reader::f_r_new<xray_re::xr_surface>>
                  (r,(ulong)*puVar1,&this->m_surfaces,read);
      }
      s = xr_reader::open_chunk(r,0x910);
      if (s != (xr_reader *)0x0) {
        xr_reader::
        r_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,read_mesh>
                  (s,&this->m_meshes,(read_mesh)this);
        xr_reader::close_chunk(r,&s);
      }
      s = xr_reader::open_chunk(r,0x921);
      if (s == (xr_reader *)0x0) {
        sVar4 = xr_reader::find_chunk(r,0x913);
        if (sVar4 != 0) {
          puVar1 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
          read_01._14_2_ = version;
          read_01._0_14_ = auStack_38;
          xr_reader::
          r_seq<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
                    (s,(ulong)*puVar1,&this->m_bones,read_01);
        }
      }
      else {
        read_00._14_2_ = version;
        read_00._0_14_ = auStack_38;
        xr_reader::
        r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
                  (s,&this->m_bones,read_00);
        xr_reader::close_chunk(r,&s);
      }
      setup_bones(this);
      sVar4 = xr_reader::find_chunk(r,0x916);
      if (sVar4 != 0) {
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        read_02._14_2_ = version;
        read_02._0_14_ = auStack_38;
        xr_reader::
        r_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_reader::f_r_new<xray_re::xr_skl_motion>>
                  (r,(ulong)*puVar1,&this->m_motions,read_02);
      }
      sVar4 = xr_reader::find_chunk(r,0x924);
      if (sVar4 != 0) {
        xr_reader::r_sz(r,&this->m_motion_refs);
      }
      sVar4 = xr_reader::find_chunk(r,0x919);
      if (sVar4 == 0) {
        sVar4 = xr_reader::find_chunk(r,0x923);
        if (sVar4 != 0) {
          puVar1 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
          read_03._14_2_ = version;
          read_03._0_14_ = auStack_38;
          xr_reader::
          r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_reader::f_r_new<xray_re::xr_partition>>
                    (r,(ulong)*puVar1,&this->m_partitions,read_03);
        }
      }
      else {
        puVar1 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        xr_reader::
        r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,read_partition_0>
                  (r,(ulong)*puVar1,&this->m_partitions,(read_partition_0)&this->m_bones);
      }
      sVar4 = xr_reader::find_chunk(r,0x920);
      if (sVar4 != 0) {
        xr_reader::r_fvector3(r,&this->m_position);
        xr_reader::r_fvector3(r,&this->m_rotation);
      }
      sVar4 = xr_reader::find_chunk(r,0x922);
      if (sVar4 != 0) {
        xr_reader::r_sz(r,&this->m_owner_name);
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        this->m_creation_time = *puVar2;
        xr_reader::r_sz(r,&this->m_modif_name);
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        this->m_modified_time = *puVar2;
      }
      return;
    }
    __assertion = "version == EOBJ_VERSION";
    __line = 0x7d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                ,__line,"virtual void xray_re::xr_object::load_object(xr_reader &)");
}

Assistant:

void xr_object::load_object(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(EOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EOBJ_VERSION);

	if (!r.r_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	if (r.find_chunk(EOBJ_CHUNK_USERDATA)) {
		r.r_sz(m_userdata);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_LOD_REF)) {
		r.r_sz(m_lod_ref);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_SURFACES_2)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_2));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_1)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_1));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_0)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_0));
		r.debug_find_chunk();
		if (r.find_chunk(EOBJ_CHUNK_SHADERS_0)) {
			for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end();
					it != end; ++it) {
				(*it)->cshader() = r.skip_sz();
			}
			r.debug_find_chunk();
		}
	} else {
		xr_not_expected();
	}

	xr_reader* s = r.open_chunk(EOBJ_CHUNK_MESHES);
	if (s) {
		s->r_chunks(m_meshes, read_mesh(*this));
		r.close_chunk(s);
	}

	s = r.open_chunk(EOBJ_CHUNK_BONES_1);
	if (s) {
		s->r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_1));
		r.close_chunk(s);
	} else if (r.find_chunk(EOBJ_CHUNK_BONES_0)) {
		s->r_seq(r.r_u32(), m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_0));
		r.debug_find_chunk();
	}
	setup_bones();
	if (r.find_chunk(EOBJ_CHUNK_MOTIONS)) {
		r.r_seq(r.r_u32(), m_motions, xr_reader::f_r_new<xr_skl_motion>(&xr_skl_motion::load));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_MOTION_REFS)) {
		r.r_sz(m_motion_refs);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_0)) {
		r.r_seq(r.r_u32(), m_partitions, read_partition_0(m_bones));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_TRANSFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_REVISION)) {
		r.r_sz(m_owner_name);
		m_creation_time = r.r_u32();
		r.r_sz(m_modif_name);
		m_modified_time = r.r_u32();
		r.debug_find_chunk();
	}
}